

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-inl.h
# Opt level: O3

void __thiscall spdlog::spdlog_ex::spdlog_ex(spdlog_ex *this,string *msg,int last_errno)

{
  memory_buf_t outbuf;
  long *local_170 [2];
  long local_160 [2];
  buffer<char> local_150;
  char local_130 [256];
  
  *(undefined ***)this = &PTR__spdlog_ex_0044b1c0;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  (this->msg_)._M_string_length = 0;
  (this->msg_).field_2._M_local_buf[0] = '\0';
  local_150.size_ = 0;
  local_150._vptr_buffer = (_func_int **)&PTR_grow_0044b2f0;
  local_150.capacity_ = 0xfa;
  local_150.ptr_ = local_130;
  ::fmt::v9::format_system_error(&local_150,last_errno,(msg->_M_dataplus)._M_p);
  local_170[0] = local_160;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_170,local_150.ptr_,local_150.ptr_ + local_150.size_);
  std::__cxx11::string::operator=((string *)&this->msg_,(string *)local_170);
  if (local_170[0] != local_160) {
    operator_delete(local_170[0],local_160[0] + 1);
  }
  if (local_150.ptr_ != local_130) {
    operator_delete(local_150.ptr_,local_150.capacity_);
  }
  return;
}

Assistant:

SPDLOG_INLINE spdlog_ex::spdlog_ex(const std::string &msg, int last_errno) {
#ifdef SPDLOG_USE_STD_FORMAT
    msg_ = std::system_error(std::error_code(last_errno, std::generic_category()), msg).what();
#else
    memory_buf_t outbuf;
    fmt::format_system_error(outbuf, last_errno, msg.c_str());
    msg_ = fmt::to_string(outbuf);
#endif
}